

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<std::unique_ptr<libaom_test::Encoder,_std::default_delete<libaom_test::Encoder>_>_>
     ::Print(unique_ptr<libaom_test::Encoder,_std::default_delete<libaom_test::Encoder>_> *value,
            ostream *os)

{
  unique_ptr<libaom_test::Encoder,_std::default_delete<libaom_test::Encoder>_> *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  PrintTo<libaom_test::Encoder,std::default_delete<libaom_test::Encoder>>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }